

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type)

{
  bool bVar1;
  uint uVar2;
  CompilerError *this_00;
  ulong uVar3;
  string local_48;
  
  if (((this->backend).use_array_constructor == true) &&
     (1 < (type->array).super_VectorView<unsigned_int>.buffer_size)) {
    if ((this->options).flatten_multidimensional_arrays == true) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Cannot flatten constructors of multidimensional array constructors, e.g. float[][]()."
                );
LAB_002ca2c5:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = (this->options).es;
    uVar2 = (this->options).version;
    if (uVar2 < 0x1ae && bVar1 == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"GL_ARB_arrays_of_arrays","");
      require_extension_internal(this,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    else if ((bVar1 & uVar2 < 0x136) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Arrays of arrays not supported before ESSL version 310.");
      goto LAB_002ca2c5;
    }
  }
  (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,type,0);
  if (((this->backend).use_array_constructor == true) &&
     ((type->array).super_VectorView<unsigned_int>.buffer_size != 0)) {
    uVar3 = 1;
    do {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      bVar1 = uVar3 < (type->array).super_VectorView<unsigned_int>.buffer_size;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl_constructor(const SPIRType &type)
{
	if (backend.use_array_constructor && type.array.size() > 1)
	{
		if (options.flatten_multidimensional_arrays)
			SPIRV_CROSS_THROW("Cannot flatten constructors of multidimensional array constructors, "
			                  "e.g. float[][]().");
		else if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_arrays_of_arrays");
		else if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310.");
	}

	auto e = type_to_glsl(type);
	if (backend.use_array_constructor)
	{
		for (uint32_t i = 0; i < type.array.size(); i++)
			e += "[]";
	}
	return e;
}